

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>const&>,testing::Matcher<int>,testing::Matcher<unsigned_int>>,std::tuple<std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>const&,int,unsigned_int>>
               (tuple<testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>
                *matcher_tuple,
               tuple<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int>
               *value_tuple)

{
  bool bVar1;
  MatcherBase<int> *this;
  __tuple_element_t<1UL,_tuple<const_unique_ptr<SDL_Surface,_function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int>_>
  *x;
  undefined1 local_19;
  tuple<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int>
  *value_tuple_local;
  tuple<testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>
  *matcher_tuple_local;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>const&>,testing::Matcher<int>,testing::Matcher<unsigned_int>>,std::tuple<std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>const&,int,unsigned_int>>
                    (matcher_tuple,value_tuple);
  local_19 = false;
  if (bVar1) {
    this = &std::
            get<1ul,testing::Matcher<std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>const&>,testing::Matcher<int>,testing::Matcher<unsigned_int>>
                      (matcher_tuple)->super_MatcherBase<int>;
    x = std::
        get<1ul,std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>const&,int,unsigned_int>
                  (value_tuple);
    local_19 = MatcherBase<int>::Matches(this,x);
  }
  return local_19;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }